

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::Login(World *this,Character *character)

{
  TileSpec TVar1;
  Map *pMVar2;
  Character *local_18;
  
  local_18 = character;
  std::vector<Character_*,_std::allocator<Character_*>_>::push_back(&this->characters,&local_18);
  pMVar2 = GetMap(this,local_18->mapid);
  if ((pMVar2->relog_x != '\0') || (pMVar2 = GetMap(this,local_18->mapid), pMVar2->relog_y != '\0'))
  {
    pMVar2 = GetMap(this,local_18->mapid);
    local_18->x = pMVar2->relog_x;
    pMVar2 = GetMap(this,local_18->mapid);
    local_18->y = pMVar2->relog_y;
  }
  pMVar2 = GetMap(this,local_18->mapid);
  if (local_18->sitting == SIT_CHAIR) {
    TVar1 = Map::GetSpec(pMVar2,local_18->x,local_18->y);
    switch(TVar1) {
    case ChairDown:
      local_18->direction = DIRECTION_DOWN;
      break;
    case ChairLeft:
      local_18->direction = DIRECTION_LEFT;
      break;
    case ChairRight:
      local_18->direction = DIRECTION_RIGHT;
      break;
    case ChairUp:
      local_18->direction = DIRECTION_UP;
      break;
    case ChairDownRight:
      local_18->direction = (local_18->direction == DIRECTION_RIGHT) * '\x03';
      break;
    case ChairUpLeft:
      local_18->direction = DIRECTION_UP - (local_18->direction == DIRECTION_LEFT);
      break;
    case ChairAll:
      break;
    default:
      local_18->sitting = SIT_STAND;
    }
  }
  Map::Enter(pMVar2,local_18,WARP_ANIMATION_NONE);
  Character::Login(local_18);
  return;
}

Assistant:

void World::Login(Character *character)
{
	this->characters.push_back(character);

	if (this->GetMap(character->mapid)->relog_x || this->GetMap(character->mapid)->relog_y)
	{
		character->x = this->GetMap(character->mapid)->relog_x;
		character->y = this->GetMap(character->mapid)->relog_y;
	}

	Map* map = this->GetMap(character->mapid);

	if (character->sitting == SIT_CHAIR)
	{
		Map_Tile::TileSpec spec = map->GetSpec(character->x, character->y);

		if (spec == Map_Tile::ChairDown)
			character->direction = DIRECTION_DOWN;
		else if (spec == Map_Tile::ChairUp)
			character->direction = DIRECTION_UP;
		else if (spec == Map_Tile::ChairLeft)
			character->direction = DIRECTION_LEFT;
		else if (spec == Map_Tile::ChairRight)
			character->direction = DIRECTION_RIGHT;
		else if (spec == Map_Tile::ChairDownRight)
			character->direction = character->direction == DIRECTION_RIGHT ? DIRECTION_RIGHT : DIRECTION_DOWN;
		else if (spec == Map_Tile::ChairUpLeft)
			character->direction = character->direction == DIRECTION_LEFT ? DIRECTION_LEFT : DIRECTION_UP;
		else if (spec != Map_Tile::ChairAll)
			character->sitting = SIT_STAND;
	}

	map->Enter(character);
	character->Login();
}